

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::DuplicateOrdinalDetector::check
          (DuplicateOrdinalDetector *this,Reader ordinal)

{
  bool bVar1;
  uint uVar2;
  ErrorReporter *pEVar3;
  undefined8 uVar4;
  Maybe<capnp::compiler::LocatedInteger::Reader> *pMVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char (*in_R8) [46];
  char (*params_2) [23];
  anon_union_48_1_a8c68091_for_NullableValue<capnp::compiler::LocatedInteger::Reader>_2 *paVar11;
  String local_48;
  char local_30 [8];
  
  if (ordinal._reader.dataSize < 0x40) {
    uVar8 = 0;
  }
  else {
    uVar8 = *ordinal._reader.data;
  }
  uVar2 = this->expectedOrdinal;
  if (uVar8 < uVar2) {
    uVar8 = 0;
    uVar10 = 0;
    if (0x5f < ordinal._reader.dataSize) {
      uVar10 = (ulong)*(uint *)((long)ordinal._reader.data + 8);
    }
    if (0x7f < ordinal._reader.dataSize) {
      uVar8 = (ulong)*(uint *)((long)ordinal._reader.data + 0xc);
    }
    params_2 = (char (*) [23])0x1a;
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar10,uVar8,"Duplicate ordinal number.");
    bVar1 = (this->lastOrdinalLocation).ptr.isSet;
    paVar11 = (anon_union_48_1_a8c68091_for_NullableValue<capnp::compiler::LocatedInteger::Reader>_2
               *)0x0;
    if (bVar1 != false) {
      paVar11 = &(this->lastOrdinalLocation).ptr.field_1;
    }
    if (bVar1 == true) {
      if (*(uint *)((long)paVar11 + 0x20) < 0x40) {
        local_30[0] = '\0';
        local_30[1] = '\0';
        local_30[2] = '\0';
        local_30[3] = '\0';
        local_30[4] = '\0';
        local_30[5] = '\0';
        local_30[6] = '\0';
        local_30[7] = '\0';
      }
      else {
        local_30 = *(paVar11->value)._reader.data;
      }
      pEVar3 = this->errorReporter;
      kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
                (&local_48,(kj *)"Ordinal @",(char (*) [10])local_30,
                 (unsigned_long *)" originally used here.",params_2);
      pcVar9 = local_48.content.ptr;
      if (local_48.content.size_ == 0) {
        pcVar9 = "";
      }
      uVar8 = 0;
      uVar10 = 0;
      if (0x5f < *(uint *)((long)paVar11 + 0x20)) {
        uVar10 = (ulong)*(uint *)((long)(paVar11->value)._reader.data + 8);
      }
      if (0x7f < *(uint *)((long)paVar11 + 0x20)) {
        uVar8 = (ulong)*(uint *)((long)(paVar11->value)._reader.data + 0xc);
      }
      (**pEVar3->_vptr_ErrorReporter)
                (pEVar3,uVar10,uVar8,pcVar9,local_48.content.size_ + (local_48.content.size_ == 0));
      sVar6 = local_48.content.size_;
      pcVar9 = local_48.content.ptr;
      if (local_48.content.ptr != (char *)0x0) {
        local_48.content.ptr = (char *)0x0;
        local_48.content.size_ = 0;
        (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                  (local_48.content.disposer,pcVar9,1,sVar6,sVar6,0);
      }
      if ((this->lastOrdinalLocation).ptr.isSet == true) {
        (this->lastOrdinalLocation).ptr.isSet = false;
      }
    }
  }
  else {
    if (ordinal._reader.dataSize < 0x40) {
      uVar8 = 0;
    }
    else {
      uVar8 = *ordinal._reader.data;
    }
    if (uVar2 < uVar8) {
      pEVar3 = this->errorReporter;
      kj::str<char_const(&)[18],unsigned_int&,char_const(&)[46]>
                (&local_48,(kj *)"Skipped ordinal @",(char (*) [18])&this->expectedOrdinal,
                 (uint *)".  Ordinals must be sequential with no holes.",in_R8);
      pcVar9 = local_48.content.ptr;
      if (local_48.content.size_ == 0) {
        pcVar9 = "";
      }
      uVar8 = 0;
      uVar10 = 0;
      if (0x5f < ordinal._reader.dataSize) {
        uVar10 = (ulong)*(uint *)((long)ordinal._reader.data + 8);
      }
      if (0x7f < ordinal._reader.dataSize) {
        uVar8 = (ulong)*(uint *)((long)ordinal._reader.data + 0xc);
      }
      (**pEVar3->_vptr_ErrorReporter)
                (pEVar3,uVar10,uVar8,pcVar9,local_48.content.size_ + (local_48.content.size_ == 0));
      sVar6 = local_48.content.size_;
      pcVar9 = local_48.content.ptr;
      if (local_48.content.ptr != (char *)0x0) {
        local_48.content.ptr = (char *)0x0;
        local_48.content.size_ = 0;
        (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                  (local_48.content.disposer,pcVar9,1,sVar6,sVar6,0);
      }
      uVar7 = 1;
      if (0x3f < ordinal._reader.dataSize) {
        uVar7 = *ordinal._reader.data + 1;
      }
      this->expectedOrdinal = uVar7;
    }
    else {
      this->expectedOrdinal = uVar2 + 1;
      if ((this->lastOrdinalLocation).ptr.isSet == true) {
        (this->lastOrdinalLocation).ptr.isSet = false;
      }
      uVar4 = ordinal._reader._32_8_;
      pMVar5 = &this->lastOrdinalLocation;
      *(int *)((long)&(pMVar5->ptr).field_1 + 0x20) = (int)uVar4;
      *(short *)((long)&(pMVar5->ptr).field_1 + 0x24) = (short)((ulong)uVar4 >> 0x20);
      *(short *)((long)&(pMVar5->ptr).field_1 + 0x26) = (short)((ulong)uVar4 >> 0x30);
      *(int *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x28) = ordinal._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x2c) =
           ordinal._reader._44_4_;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.data = ordinal._reader.data;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.pointers = ordinal._reader.pointers;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.segment = ordinal._reader.segment;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.capTable = ordinal._reader.capTable;
      (this->lastOrdinalLocation).ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void check(LocatedInteger::Reader ordinal) {
    if (ordinal.getValue() < expectedOrdinal) {
      errorReporter.addErrorOn(ordinal, "Duplicate ordinal number.");
      KJ_IF_SOME(last, lastOrdinalLocation) {
        errorReporter.addErrorOn(
            last, kj::str("Ordinal @", last.getValue(), " originally used here."));
        // Don't report original again.
        lastOrdinalLocation = kj::none;
      }
    } else if (ordinal.getValue() > expectedOrdinal) {
      errorReporter.addErrorOn(ordinal,
          kj::str("Skipped ordinal @", expectedOrdinal, ".  Ordinals must be sequential with no "
                  "holes."));
      expectedOrdinal = ordinal.getValue() + 1;
    } else {
      ++expectedOrdinal;
      lastOrdinalLocation = ordinal;
    }
  }